

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O1

bool __thiscall
UnscentedKalmanFilter::GenerateAugmentedSigmaPoints
          (UnscentedKalmanFilter *this,VectorXd *x,MatrixXd *P,MatrixXd *Xsig_aug)

{
  long lVar1;
  int iVar2;
  DenseIndex DVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  ostream *poVar9;
  range_error *this_00;
  undefined8 *puVar10;
  int iVar11;
  ulong uVar12;
  double *pdVar13;
  char *pcVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *m;
  Index col;
  ulong uVar18;
  Index inner;
  long lVar19;
  Index row;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  Index index_4;
  Index size;
  long lVar23;
  Index size_2;
  VectorXd x_aug;
  MatrixXd P_aug;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> lltOfPaug;
  MatrixXd L;
  DenseStorage<double,__1,__1,_1,_0> local_178;
  DenseStorage<double,__1,__1,__1,_0> local_168;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_150;
  UnscentedKalmanFilter *local_148;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_140;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *local_120;
  undefined1 local_118 [40];
  bool local_f0;
  
  DVar3 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar23 = (long)this->n_aug_;
  local_150 = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_aug;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_178,lVar23,lVar23,1);
  if (lVar23 < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Matrix.h"
                  ,0xf0,
                  "Eigen::Matrix<double, -1, 1>::Matrix(Index) [_Scalar = double, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  local_168.m_data = (double *)0x0;
  local_168.m_rows = 0;
  local_168.m_cols = 0;
  uVar12 = (ulong)this->n_aug_;
  if ((long)uVar12 < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/PlainObjectBase.h"
                  ,0xf1,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  if ((this->n_aug_ != 0) &&
     (auVar5._8_8_ = 0, auVar5._0_8_ = uVar12,
     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar5,0) < (long)uVar12)) {
    puVar10 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar10 = operator_delete;
    __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_168,uVar12 * uVar12,uVar12,uVar12);
  iVar11 = (int)DVar3;
  uVar12 = (ulong)iVar11;
  if ((long)uVar12 < 0 && local_178.m_data != (double *)0x0) {
    pcVar14 = 
    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
    ;
LAB_0011c2f4:
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/MapBase.h"
                  ,0x94,pcVar14);
  }
  if ((-1 < (long)uVar12) && ((long)uVar12 <= local_178.m_rows)) {
    if (uVar12 == (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows) {
      uVar15 = (ulong)((uint)((ulong)local_178.m_data >> 3) & 1);
      if ((long)uVar12 <= (long)uVar15) {
        uVar15 = uVar12;
      }
      if (((ulong)local_178.m_data & 7) != 0) {
        uVar15 = uVar12;
      }
      lVar23 = uVar12 - uVar15;
      if (0 < (long)uVar15) {
        pdVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        uVar18 = 0;
        do {
          local_178.m_data[uVar18] = pdVar13[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar15 != uVar18);
      }
      uVar18 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
      if (1 < lVar23) {
        do {
          pdVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + uVar15;
          dVar6 = pdVar13[1];
          local_178.m_data[uVar15] = *pdVar13;
          (local_178.m_data + uVar15)[1] = dVar6;
          uVar15 = uVar15 + 2;
        } while ((long)uVar15 < (long)uVar18);
      }
      if ((long)uVar18 < (long)uVar12) {
        pdVar13 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data;
        do {
          local_178.m_data[uVar18] = pdVar13[uVar18];
          uVar18 = uVar18 + 1;
        } while (uVar12 != uVar18);
      }
      iVar2 = this->n_aug_;
      uVar15 = uVar12;
      if (iVar11 < iVar2) {
        do {
          if ((iVar11 < 0) || (local_178.m_rows <= (long)uVar15)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x18a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_178.m_data[uVar15] = 0.0;
          uVar15 = uVar15 + 1;
        } while ((long)iVar2 != uVar15);
      }
      local_118._0_8_ = local_168.m_rows;
      local_118._8_8_ = local_168.m_cols;
      local_118._16_8_ = 0;
      if ((local_168.m_cols | local_168.m_rows) < 0) {
        __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                      ,0x3f,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_168,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_118);
      m = local_150;
      if ((local_168.m_rows < (long)uVar12) || (local_168.m_cols < (long)uVar12)) {
        pcVar14 = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
        ;
        goto LAB_0011c484;
      }
      if ((uVar12 == (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_rows) &&
         (uVar12 == (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_cols)) {
        if (0 < (long)uVar12) {
          uVar15 = (ulong)((uint)((ulong)local_168.m_data >> 3) & 1);
          if (((ulong)local_168.m_data & 7) != 0) {
            uVar15 = uVar12;
          }
          lVar23 = 0;
          uVar18 = 0;
          pdVar13 = local_168.m_data;
          do {
            if (0 < (long)uVar15) {
              lVar19 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
              pdVar4 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data;
              uVar20 = 0;
              do {
                pdVar13[uVar20] = *(double *)((long)pdVar4 + uVar20 * 8 + lVar19 * lVar23);
                uVar20 = uVar20 + 1;
              } while (uVar15 != uVar20);
            }
            uVar22 = uVar12 - uVar15 & 0xfffffffffffffffe;
            lVar19 = uVar22 + uVar15;
            uVar20 = uVar15;
            if (0 < (long)uVar22) {
              do {
                pdVar4 = (double *)
                         ((long)(P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                ).m_storage.m_data +
                         uVar20 * 8 +
                         (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                         m_storage.m_rows * lVar23);
                dVar6 = pdVar4[1];
                pdVar13[uVar20] = *pdVar4;
                (pdVar13 + uVar20)[1] = dVar6;
                uVar20 = uVar20 + 2;
              } while ((long)uVar20 < lVar19);
            }
            if (lVar19 < (long)uVar12) {
              lVar16 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_rows;
              pdVar4 = (P->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data;
              do {
                pdVar13[lVar19] = *(double *)((long)pdVar4 + lVar19 * 8 + lVar16 * lVar23);
                lVar19 = lVar19 + 1;
              } while (lVar19 < (long)uVar12);
            }
            uVar15 = (long)(uVar15 + ((uint)local_168.m_rows & 1)) % 2;
            if ((long)uVar12 < (long)uVar15) {
              uVar15 = uVar12;
            }
            uVar18 = uVar18 + 1;
            pdVar13 = pdVar13 + local_168.m_rows;
            lVar23 = lVar23 + 8;
          } while (uVar18 != uVar12);
        }
        lVar23 = (long)this->n_aug_;
        if (((1 < lVar23) && (lVar19 = lVar23 + -2, lVar19 < local_168.m_rows)) &&
           (lVar19 < local_168.m_cols)) {
          local_168.m_data[lVar19 * local_168.m_rows + lVar23 + -2] = this->std_a_ * this->std_a_;
          lVar19 = lVar23 + -1;
          if ((lVar19 < local_168.m_rows) && (lVar19 < local_168.m_cols)) {
            local_168.m_data[local_168.m_rows * lVar19 + lVar23 + -1] =
                 this->std_yawdd_ * this->std_yawdd_;
            Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
                      (&local_140,(MatrixType *)&local_168);
            if (local_140.m_isInitialized == false) {
              __assert_fail("m_isInitialized && \"LLT is not initialized.\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Cholesky/LLT.h"
                            ,0xa6,
                            "ComputationInfo Eigen::LLT<Eigen::Matrix<double, -1, -1>>::info() const [MatrixType = Eigen::Matrix<double, -1, -1>, UpLo = 1]"
                           );
            }
            if (local_140.m_info == NumericalIssue) {
              if (this->debug_ != 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"LLT failed!",0xb);
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
                          ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_118,
                           (MatrixType *)&local_168,true);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_aug:",6)
                ;
                poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                           &local_168);
                std::endl<char,std::char_traits<char>>(poVar9);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Eigenvalues of P_aug:",0x15);
                poVar9 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
                if (local_f0 == false) {
                  __assert_fail("m_isInitialized && \"EigenSolver is not initialized.\"",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Eigenvalues/EigenSolver.h"
                                ,0xf5,
                                "const EigenvalueType &Eigen::EigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                               );
                }
                poVar9 = Eigen::operator<<(poVar9,(
                                                  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>
                                                  *)(local_118 + 0x18));
                std::endl<char,std::char_traits<char>>(poVar9);
                Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver
                          ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_118);
              }
              this_00 = (range_error *)__cxa_allocate_exception(0x10);
              std::range_error::range_error(this_00,"LLT failed");
              __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
            }
            local_120 = &local_140;
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_118,
                       (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
                        *)&local_120);
            uVar12 = *(ulong *)m;
            uVar15 = *(ulong *)(m + 8);
            if ((long)uVar15 < 0 && uVar12 != 0) {
LAB_0011c2df:
              pcVar14 = 
              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
              ;
              goto LAB_0011c2f4;
            }
            if ((long)*(ulong *)(m + 0x10) < 1) {
LAB_0011c2fe:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                            ,0x76,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (uVar15 == local_178.m_rows) {
              uVar18 = (ulong)((uint)(uVar12 >> 3) & 1);
              if ((long)uVar15 <= (long)uVar18) {
                uVar18 = uVar15;
              }
              if ((uVar12 & 7) != 0) {
                uVar18 = uVar15;
              }
              lVar23 = uVar15 - uVar18;
              if (0 < (long)uVar18) {
                uVar20 = 0;
                do {
                  *(double *)(uVar12 + uVar20 * 8) = local_178.m_data[uVar20];
                  uVar20 = uVar20 + 1;
                } while (uVar18 != uVar20);
              }
              uVar20 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar18;
              if (1 < lVar23) {
                do {
                  dVar6 = (local_178.m_data + uVar18)[1];
                  pdVar13 = (double *)(uVar12 + uVar18 * 8);
                  *pdVar13 = local_178.m_data[uVar18];
                  pdVar13[1] = dVar6;
                  uVar18 = uVar18 + 2;
                } while ((long)uVar18 < (long)uVar20);
              }
              if ((long)uVar20 < (long)uVar15) {
                do {
                  *(double *)(uVar12 + uVar20 * 8) = local_178.m_data[uVar20];
                  uVar20 = uVar20 + 1;
                } while (uVar15 != uVar20);
              }
              dVar6 = (double)this->n_aug_ + this->lambda_;
              if (dVar6 < 0.0) {
                dVar6 = sqrt(dVar6);
              }
              else {
                dVar6 = SQRT(dVar6);
              }
              uVar12 = (ulong)(uint)this->n_aug_;
              if (0 < this->n_aug_) {
                lVar19 = 8;
                iVar11 = 1;
                lVar16 = 0;
                lVar23 = 0;
                do {
                  local_148 = this;
                  if (((long)local_118._8_8_ < 0) &&
                     ((double *)(local_118._0_8_ + local_118._8_8_ * lVar23 * 8) != (double *)0x0))
                  goto LAB_0011c2df;
                  if ((long)local_118._16_8_ <= lVar23) goto LAB_0011c2fe;
                  if (local_178.m_rows != local_118._8_8_) {
                    pcVar14 = 
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
                    ;
LAB_0011c37f:
                    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseBinaryOp.h"
                                  ,0x84,pcVar14);
                  }
                  lVar1 = lVar23 + 1;
                  uVar15 = *(ulong *)m;
                  uVar18 = *(ulong *)(m + 8);
                  uVar20 = uVar18 * lVar1 * 8 + uVar15;
                  if ((long)uVar18 < 0 && uVar20 != 0) goto LAB_0011c2df;
                  if ((long)*(ulong *)(m + 0x10) <= lVar1) goto LAB_0011c2fe;
                  if (uVar18 != local_118._8_8_) {
                    pcVar14 = 
                    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
                    ;
                    goto LAB_0011c360;
                  }
                  uVar22 = (ulong)((uint)(uVar20 >> 3) & 1);
                  if ((long)uVar18 <= (long)uVar22) {
                    uVar22 = uVar18;
                  }
                  if ((uVar20 & 7) != 0) {
                    uVar22 = uVar18;
                  }
                  if (0 < (long)uVar22) {
                    uVar20 = 0;
                    do {
                      *(double *)(uVar18 * lVar19 + uVar15 + uVar20 * 8) =
                           *(double *)(local_118._0_8_ + uVar20 * 8 + local_118._8_8_ * lVar16) *
                           dVar6 + local_178.m_data[uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar22 != uVar20);
                  }
                  lVar21 = uVar18 - uVar22;
                  uVar20 = (lVar21 - (lVar21 >> 0x3f) & 0xfffffffffffffffeU) + uVar22;
                  if (1 < lVar21) {
                    do {
                      dVar7 = (local_178.m_data + uVar22)[1];
                      pdVar13 = (double *)(local_118._0_8_ + uVar22 * 8 + local_118._8_8_ * lVar16);
                      dVar8 = pdVar13[1];
                      pdVar4 = (double *)(uVar18 * lVar19 + uVar15 + uVar22 * 8);
                      *pdVar4 = *pdVar13 * dVar6 + local_178.m_data[uVar22];
                      pdVar4[1] = dVar8 * dVar6 + dVar7;
                      uVar22 = uVar22 + 2;
                    } while ((long)uVar22 < (long)uVar20);
                  }
                  if ((long)uVar20 < (long)uVar18) {
                    do {
                      *(double *)(uVar15 + uVar18 * lVar19 + uVar20 * 8) =
                           *(double *)(local_118._0_8_ + uVar20 * 8 + local_118._8_8_ * lVar16) *
                           dVar6 + local_178.m_data[uVar20];
                      uVar20 = uVar20 + 1;
                    } while (uVar18 != uVar20);
                  }
                  if (((long)local_118._8_8_ < 0) &&
                     ((double *)(local_118._0_8_ + local_118._8_8_ * lVar23 * 8) != (double *)0x0))
                  goto LAB_0011c2df;
                  if ((long)local_118._16_8_ <= lVar23) goto LAB_0011c2fe;
                  if (local_178.m_rows != local_118._8_8_) {
                    pcVar14 = 
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>]"
                    ;
                    goto LAB_0011c37f;
                  }
                  iVar2 = (int)uVar12;
                  iVar17 = iVar2 + (int)lVar1;
                  uVar15 = *(ulong *)local_150;
                  uVar18 = *(ulong *)(local_150 + 8);
                  uVar12 = uVar15 + uVar18 * (long)iVar17 * 8;
                  if (((long)uVar18 < 0) && (uVar12 != 0)) goto LAB_0011c2df;
                  if ((iVar17 < 0) || ((long)*(ulong *)(local_150 + 0x10) <= (long)iVar17))
                  goto LAB_0011c2fe;
                  if (uVar18 != local_118._8_8_) {
                    pcVar14 = 
                    "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>>]"
                    ;
                    goto LAB_0011c360;
                  }
                  uVar20 = (ulong)((uint)(uVar12 >> 3) & 1);
                  if ((long)uVar18 <= (long)uVar20) {
                    uVar20 = uVar18;
                  }
                  if ((uVar12 & 7) != 0) {
                    uVar20 = uVar18;
                  }
                  if (0 < (long)uVar20) {
                    uVar12 = 0;
                    do {
                      *(double *)(uVar15 + (long)(iVar2 + iVar11) * uVar18 * 8 + uVar12 * 8) =
                           local_178.m_data[uVar12] -
                           *(double *)(local_118._0_8_ + uVar12 * 8 + local_118._8_8_ * lVar16) *
                           dVar6;
                      uVar12 = uVar12 + 1;
                    } while (uVar20 != uVar12);
                  }
                  lVar23 = uVar18 - uVar20;
                  uVar12 = (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
                  if (1 < lVar23) {
                    do {
                      dVar7 = (local_178.m_data + uVar20)[1];
                      pdVar13 = (double *)(local_118._0_8_ + uVar20 * 8 + local_118._8_8_ * lVar16);
                      dVar8 = pdVar13[1];
                      pdVar4 = (double *)(uVar15 + (long)(iVar2 + iVar11) * uVar18 * 8 + uVar20 * 8)
                      ;
                      *pdVar4 = local_178.m_data[uVar20] - *pdVar13 * dVar6;
                      pdVar4[1] = dVar7 - dVar8 * dVar6;
                      uVar20 = uVar20 + 2;
                    } while ((long)uVar20 < (long)uVar12);
                  }
                  if ((long)uVar12 < (long)uVar18) {
                    do {
                      *(double *)(uVar15 + (long)(iVar2 + iVar11) * uVar18 * 8 + uVar12 * 8) =
                           local_178.m_data[uVar12] -
                           *(double *)(local_118._0_8_ + uVar12 * 8 + local_118._8_8_ * lVar16) *
                           dVar6;
                      uVar12 = uVar12 + 1;
                    } while (uVar18 != uVar12);
                  }
                  uVar12 = (ulong)this->n_aug_;
                  lVar19 = lVar19 + 8;
                  lVar16 = lVar16 + 8;
                  iVar11 = iVar11 + 1;
                  m = local_150;
                  lVar23 = lVar1;
                } while (lVar1 < (long)uVar12);
              }
              if (2 < this->debug_) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"L:\n",3);
                poVar9 = Eigen::operator<<((ostream *)&std::cout,
                                           (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                           local_118);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Xsig_aug:\n",10);
                poVar9 = Eigen::operator<<((ostream *)&std::cout,m);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                std::ostream::put((char)poVar9);
                std::ostream::flush();
              }
              free((void *)local_118._0_8_);
              free(local_140.m_matrix.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
                  );
              free(local_168.m_data);
              free(local_178.m_data);
              return true;
            }
            pcVar14 = 
            "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
            ;
            goto LAB_0011c360;
          }
        }
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x151,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      pcVar14 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>, OtherDerived = Eigen::Matrix<double, -1, -1>]"
      ;
    }
    else {
      pcVar14 = 
      "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
      ;
    }
LAB_0011c360:
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Assign.h"
                  ,0x1f9,pcVar14);
  }
  pcVar14 = 
  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0011c484:
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/Block.h"
                ,0x8d,pcVar14);
}

Assistant:

bool UnscentedKalmanFilter::GenerateAugmentedSigmaPoints(const VectorXd &x, const MatrixXd &P, MatrixXd &Xsig_aug) const {

    bool ret = true;
    int n_x = x.rows();
    
    // create augmented mean vector
    VectorXd x_aug(n_aug_);
  
    // create augmented state covariance
    MatrixXd P_aug(n_aug_, n_aug_);

    // create augmented mean state
    x_aug.head(n_x) = x;
    for (int i=n_x; i<n_aug_; i++)
	    x_aug(i) = 0.0;

    // create augmented covariance matrix
    P_aug.fill(0.0);
    P_aug.topLeftCorner(n_x,n_x) = P;
    P_aug(n_aug_-2,n_aug_-2) = std_a_*std_a_;
    P_aug(n_aug_-1,n_aug_-1) = std_yawdd_*std_yawdd_;
 
    // Take matrix square root
    // 1. compute the Cholesky decomposition of P_aug
    Eigen::LLT<MatrixXd> lltOfPaug(P_aug); 
    if (lltOfPaug.info() == Eigen::NumericalIssue) {
	// if decomposition fails, we have numerical issues
        if (debug_) {
	    std::cout << "LLT failed!" << std::endl;
	    Eigen::EigenSolver<MatrixXd> es(P_aug);
	    cout << "P_aug:" << P_aug << endl;
	    cout << "Eigenvalues of P_aug:" << endl << es.eigenvalues() << endl;
	}
	throw std::range_error("LLT failed");
    }
    // 2. get the lower triangle
    MatrixXd L = lltOfPaug.matrixL(); 

    Xsig_aug.col(0) = x_aug;
        
    double s = sqrt(lambda_+n_aug_);

    for (int i=0; i<n_aug_; i++) {
	int j = i+1;
	int k = j+n_aug_;
        Xsig_aug.col(j) = x_aug + s * L.col(i);
        Xsig_aug.col(k) = x_aug - s * L.col(i);
    }

    if (debug_ > 2) {
        std::cout << "L:\n" << L << std::endl;
        std::cout << "Xsig_aug:\n" << Xsig_aug << std::endl;
    }
    return ret;
}